

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O3

void __thiscall Assimp::glTFImporter::ImportMeshes(glTFImporter *this,Asset *r)

{
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar1;
  PrimitiveMode PVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  iterator iVar6;
  pointer pPVar7;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar8;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar9;
  BufferView *pBVar10;
  vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *pvVar11;
  long lVar12;
  aiScene *paVar13;
  long lVar14;
  pointer *ppuVar15;
  aiMesh **ppaVar16;
  Object *pOVar17;
  glTFImporter *pgVar18;
  iterator iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  pointer ppMVar26;
  aiMesh *paVar27;
  undefined4 *puVar28;
  ulong *puVar29;
  uint *puVar30;
  undefined8 *puVar31;
  aiVector3D **ppaVar32;
  aiVector3D *paVar33;
  aiFace *paVar34;
  undefined8 uVar35;
  aiMesh **ppaVar36;
  runtime_error *prVar37;
  long *plVar38;
  pointer pRVar39;
  float *pfVar40;
  Accessor *pAVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  aiMesh **ppaVar45;
  uint uVar46;
  uint uVar47;
  char *pcVar48;
  int iVar49;
  Mesh *pMVar50;
  pointer pPVar51;
  int iVar52;
  ulong *puVar53;
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  Ref<glTF::Buffer> RVar59;
  uint k;
  Indexer data;
  aiMesh *aim;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  ulong local_128;
  aiFace *local_118;
  uint local_ec;
  aiMesh *local_e8;
  undefined8 uStack_e0;
  Indexer local_d8;
  Mesh *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  glTFImporter *local_90;
  aiMesh **local_88;
  iterator iStack_80;
  aiMesh **local_78;
  Asset *local_68;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_60;
  LazyDict<glTF::Buffer> *local_58;
  string local_50;
  
  local_88 = (aiMesh **)0x0;
  iStack_80._M_current = (aiMesh **)0x0;
  local_78 = (aiMesh **)0x0;
  local_ec = 0;
  ppMVar26 = (r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_90 = this;
  local_68 = r;
  if (((long)(r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar26 & 0x7fffffff8U) != 0) {
    local_58 = &r->buffers;
    local_60 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets;
    uVar55 = 0;
    do {
      pMVar50 = ppMVar26[uVar55];
      local_b8 = pMVar50;
      if (*(size_t *)
           ((long)&(pMVar50->Extension).
                   super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                   ._M_impl + 0x10) != 0) {
        plVar1 = &pMVar50->Extension;
        pOVar17 = &pMVar50->super_Object;
        plVar54 = plVar1;
        while (plVar54 = *(list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                           **)&(plVar54->
                               super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                               )._M_impl._M_node, plVar54 != plVar1) {
          sVar5 = *(size_t *)
                   ((long)&(plVar54->
                           super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                           )._M_impl._M_node + 0x10);
          if (*(int *)(sVar5 + 8) != 0) {
            prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<glTF::Mesh::SExtension::EType>(&local_50,*(EType *)(sVar5 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0,"GLTF: Can not import mesh: unknown mesh extension (code: \"",
                           &local_50);
            plVar38 = (long *)std::__cxx11::string::append(local_b0[0]._M_local_buf);
            local_d8.accessor = (Accessor *)*plVar38;
            pAVar41 = (Accessor *)(plVar38 + 2);
            if (local_d8.accessor == pAVar41) {
              local_d8.elemSize = (size_t)(pAVar41->super_Object)._vptr_Object;
              local_d8.stride = plVar38[3];
              local_d8.accessor = (Accessor *)&local_d8.elemSize;
            }
            else {
              local_d8.elemSize = (size_t)(pAVar41->super_Object)._vptr_Object;
            }
            local_d8.data = (uint8_t *)plVar38[1];
            *plVar38 = (long)pAVar41;
            plVar38[1] = 0;
            *(undefined1 *)(plVar38 + 2) = 0;
            std::runtime_error::runtime_error(prVar37,(string *)&local_d8);
            *(undefined ***)prVar37 = &PTR__runtime_error_007fc4b8;
            __cxa_throw(prVar37,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (2 < (ulong)(((long)*(pointer *)
                                  ((long)&(local_b8->primitives).
                                          super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                          ._M_impl + 8) -
                           *(long *)&(local_b8->primitives).
                                     super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                     ._M_impl.super__Vector_impl_data >> 4) * 0x4ec4ec4ec4ec4ec5)) {
            prVar37 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_d8.accessor = (Accessor *)&local_d8.elemSize;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,
                       "GLTF: When using Open3DGC compression then only one primitive per mesh are allowed."
                       ,"");
            std::runtime_error::runtime_error(prVar37,(string *)&local_d8);
            *(undefined ***)prVar37 = &PTR__runtime_error_007fc4b8;
            __cxa_throw(prVar37,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          RVar59 = glTF::LazyDict<glTF::Buffer>::Get(local_58,*(char **)(sVar5 + 0x10));
          pMVar50 = local_b8;
          glTF::Buffer::EncodedRegion_SetCurrent
                    (((RVar59.vector)->
                     super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[RVar59._8_8_ & 0xffffffff],&pOVar17->id);
        }
      }
      iVar6._M_current =
           (local_90->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (local_90->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_60,iVar6,&local_ec);
      }
      else {
        *iVar6._M_current = local_ec;
        ppuVar15 = &(local_90->meshOffsets).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *ppuVar15 = *ppuVar15 + 1;
      }
      pPVar51 = (pMVar50->primitives).
                super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar7 = *(pointer *)
                ((long)&(pMVar50->primitives).
                        super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                        ._M_impl + 8);
      local_ec = (int)((ulong)((long)pPVar7 - (long)pPVar51) >> 4) * -0x3b13b13b + local_ec;
      if (pPVar7 != pPVar51) {
        uVar44 = 0;
        do {
          paVar27 = (aiMesh *)operator_new(0x520);
          paVar27->mPrimitiveTypes = 0;
          paVar27->mNumVertices = 0;
          paVar27->mNumFaces = 0;
          memset(&paVar27->mVertices,0,0xcc);
          paVar27->mBones = (aiBone **)0x0;
          paVar27->mMaterialIndex = 0;
          (paVar27->mName).length = 0;
          (paVar27->mName).data[0] = '\0';
          memset((paVar27->mName).data + 1,0x1b,0x3ff);
          paVar27->mNumAnimMeshes = 0;
          paVar27->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar27->mMethod = 0;
          (paVar27->mAABB).mMin.x = 0.0;
          (paVar27->mAABB).mMin.y = 0.0;
          (paVar27->mAABB).mMin.z = 0.0;
          (paVar27->mAABB).mMax.x = 0.0;
          (paVar27->mAABB).mMax.y = 0.0;
          (paVar27->mAABB).mMax.z = 0.0;
          memset(paVar27->mColors,0,0xa0);
          local_b0[0]._0_8_ = paVar27;
          if (iStack_80._M_current == local_78) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_88,iStack_80,
                       (aiMesh **)&local_b0[0]._M_allocated_capacity);
          }
          else {
            *iStack_80._M_current = paVar27;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
          uVar35 = local_b0[0]._M_allocated_capacity;
          pMVar50 = local_b8;
          uVar43 = (local_b8->super_Object).id._M_string_length;
          if (uVar43 < 0x400) {
            ((aiString *)(local_b0[0]._M_allocated_capacity + 0xec))->length = (uint)uVar43;
            memcpy((char *)(local_b0[0]._M_allocated_capacity + 0xf0),
                   (local_b8->super_Object).id._M_dataplus._M_p,uVar43);
            *(undefined1 *)(uVar35 + uVar43 + 0xf0) = 0;
          }
          iVar52 = (int)uVar44;
          if (1 < (ulong)(((long)*(pointer *)
                                  ((long)&(pMVar50->primitives).
                                          super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                          ._M_impl + 8) -
                           *(long *)&(pMVar50->primitives).
                                     super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                     ._M_impl.super__Vector_impl_data >> 4) * 0x4ec4ec4ec4ec4ec5)) {
            uVar46 = ((aiString *)(local_b0[0]._M_allocated_capacity + 0xec))->length;
            uVar42 = (ulong)uVar46;
            *(undefined1 *)(local_b0[0]._M_allocated_capacity + uVar42 + 0xf0) = 0x2d;
            pcVar48 = (char *)(local_b0[0]._M_allocated_capacity + uVar42 + 0xf1);
            uVar46 = 0x3ff - uVar46;
            uVar47 = 1;
            uVar43 = uVar44;
            if ((iVar52 < 0) && (1 < uVar46)) {
              *(undefined1 *)(local_b0[0]._M_allocated_capacity + uVar42 + 0xf1) = 0x2d;
              pcVar48 = (char *)(local_b0[0]._M_allocated_capacity + uVar42 + 0xf2);
              uVar43 = (ulong)(uint)-iVar52;
              uVar47 = 2;
            }
            if (uVar47 < uVar46) {
              iVar49 = 1000000000;
              bVar56 = false;
              do {
                lVar14 = (long)(int)uVar43 / (long)iVar49;
                bVar57 = (int)lVar14 != 0;
                bVar58 = iVar49 == 1;
                if ((bVar56 || bVar58) || bVar57) {
                  *pcVar48 = (char)lVar14 + '0';
                  pcVar48 = pcVar48 + 1;
                  uVar47 = uVar47 + 1;
                  uVar43 = (long)(int)uVar43 % (long)iVar49 & 0xffffffff;
                  if (iVar49 == 1) break;
                }
                iVar49 = iVar49 / 10;
                bVar56 = (bool)(bVar56 | bVar58 | bVar57);
              } while (uVar47 < uVar46);
            }
            *pcVar48 = '\0';
            ((aiString *)(local_b0[0]._M_allocated_capacity + 0xec))->length =
                 ((aiString *)(local_b0[0]._M_allocated_capacity + 0xec))->length + uVar47;
          }
          pPVar51 = pPVar51 + uVar44;
          if ((ulong)pPVar51->mode < 7) {
            *(uint *)local_b0[0]._0_8_ =
                 *(uint *)local_b0[0]._0_8_ | *(uint *)(&DAT_006ed6f4 + (ulong)pPVar51->mode * 4);
          }
          pRVar39 = *(pointer *)
                     &(pPVar51->attributes).position.
                      super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                      ._M_impl;
          if ((*(pointer *)
                ((long)&(pPVar51->attributes).position.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                + 8) != pRVar39) &&
             (pRVar39->vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
             ) {
            *(uint *)(local_b0[0]._M_allocated_capacity + 4) =
                 *(uint *)(*(long *)(*(long *)&(pRVar39->vector->
                                               super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                               )._M_impl + (ulong)pRVar39->index * 8) + 100);
            puVar31 = *(undefined8 **)
                       &(pPVar51->attributes).position.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        ._M_impl;
            glTF::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)(*(long *)*puVar31 + (ulong)*(uint *)(puVar31 + 1) * 8),
                       (aiVector3D **)(local_b0[0]._M_allocated_capacity + 0x10));
          }
          pRVar39 = (pPVar51->attributes).normal.
                    super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(pointer *)
                ((long)&(pPVar51->attributes).normal.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                + 8) != pRVar39) &&
             (pRVar39->vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
             ) {
            glTF::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (*(long *)&(pRVar39->vector->
                                   super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                   )._M_impl + (ulong)pRVar39->index * 8),
                       (aiVector3D **)(local_b0[0]._M_allocated_capacity + 0x18));
          }
          pRVar39 = (pPVar51->attributes).texcoord.
                    super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pPVar51->attributes).texcoord.
                       super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
               + 8) != pRVar39) {
            uVar44 = 0;
            do {
              glTF::Accessor::ExtractData<aiVector3t<float>>
                        (*(Accessor **)
                          (*(long *)&((pRVar39[uVar44].vector)->
                                     super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                     )._M_impl + (ulong)pRVar39[uVar44].index * 8),
                         (aiVector3t<float> **)
                         (local_b0[0]._M_allocated_capacity + uVar44 * 8 + 0x70));
              lVar14 = *(long *)&(pPVar51->attributes).texcoord.
                                 super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                 ._M_impl.super__Vector_impl_data;
              *(undefined4 *)(local_b0[0]._M_allocated_capacity + uVar44 * 4 + 0xb0) =
                   *(undefined4 *)
                    (&DAT_007fc7d8 +
                    (ulong)*(uint *)(*(long *)(**(long **)(lVar14 + uVar44 * 0x10) +
                                              (ulong)*(uint *)(lVar14 + 8 + uVar44 * 0x10) * 8) +
                                    0x68) * 0x10);
              if (*(uint *)(local_b0[0]._M_allocated_capacity + 4) != 0) {
                pfVar40 = (float *)(*(long *)(local_b0[0]._M_allocated_capacity + uVar44 * 8 + 0x70)
                                   + 4);
                uVar43 = 0;
                do {
                  *pfVar40 = 1.0 - *pfVar40;
                  uVar43 = uVar43 + 1;
                  pfVar40 = pfVar40 + 3;
                } while (uVar43 < *(uint *)(local_b0[0]._M_allocated_capacity + 4));
              }
              if (6 < uVar44) break;
              uVar44 = uVar44 + 1;
              pRVar39 = (pPVar51->attributes).texcoord.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar44 < (ulong)((long)*(pointer *)
                                             ((long)&(pPVar51->attributes).texcoord.
                                                                                                          
                                                  super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                             + 8) - (long)pRVar39 >> 4));
          }
          pvVar8 = (pPVar51->indices).vector;
          if (pvVar8 != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
            pAVar41 = *(Accessor **)
                       (*(long *)&(pvVar8->
                                  super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                  )._M_impl + (ulong)(pPVar51->indices).index * 8);
            uVar46 = pAVar41->count;
            uVar44 = (ulong)uVar46;
            pvVar9 = (pAVar41->bufferView).vector;
            if (pvVar9 == (vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *)0x0) {
LAB_0063a34c:
              local_d8.data = (uint8_t *)0x0;
            }
            else {
              pBVar10 = (pvVar9->
                        super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start[(pAVar41->bufferView).index];
              pvVar11 = (pBVar10->buffer).vector;
              if (pvVar11 == (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0)
              goto LAB_0063a34c;
              lVar14 = *(long *)(*(long *)&pvVar11->
                                           super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>
                                + (ulong)(pBVar10->buffer).index * 8);
              lVar12 = *(long *)(lVar14 + 0x60);
              if (lVar12 == 0) goto LAB_0063a34c;
              uVar43 = (ulong)pAVar41->byteOffset + pBVar10->byteOffset;
              puVar29 = *(ulong **)(lVar14 + 0x58);
              if (puVar29 == (ulong *)0x0) {
LAB_0063a487:
                local_d8.data = (uint8_t *)(lVar12 + uVar43);
              }
              else {
                uVar42 = *puVar29;
                if ((uVar43 < uVar42) || (uVar42 + puVar29[3] <= uVar43)) goto LAB_0063a487;
                local_d8.data = (uint8_t *)((uVar43 - uVar42) + puVar29[2]);
              }
            }
            local_d8.accessor = pAVar41;
            uVar47 = glTF::Accessor::GetElementSize(pAVar41);
            local_d8.elemSize = (size_t)uVar47;
            local_d8.stride = (ulong)pAVar41->byteStride;
            if ((ulong)pAVar41->byteStride == 0) {
              local_d8.stride = local_d8.elemSize;
            }
            if (local_d8.data == (uint8_t *)0x0) {
              __assert_fail("data.IsValid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF/glTFImporter.cpp"
                            ,0x13f,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
            }
            switch(pPVar51->mode) {
            case PrimitiveMode_POINTS:
              puVar29 = (ulong *)operator_new__(uVar44 * 0x10 + 8);
              *puVar29 = uVar44;
              local_118 = (aiFace *)(puVar29 + 1);
              uVar47 = 0;
              uVar35 = local_b0[0]._M_allocated_capacity;
              if (uVar44 != 0) {
                paVar34 = local_118;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != local_118 + uVar44);
                if (uVar44 != 0) {
                  uVar43 = 0;
                  do {
                    uVar47 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,(int)uVar43);
                    *(undefined4 *)(puVar29 + 1) = 1;
                    puVar30 = (uint *)operator_new__(4);
                    puVar29[2] = (ulong)puVar30;
                    *puVar30 = uVar47;
                    uVar43 = uVar43 + 1;
                    uVar35 = local_b0[0]._M_allocated_capacity;
                    puVar29 = puVar29 + 2;
                    uVar47 = uVar46;
                  } while (uVar44 != uVar43);
                }
              }
              break;
            case PrimitiveMode_LINES:
              uVar43 = (ulong)(uVar46 >> 1);
              puVar29 = (ulong *)operator_new__(uVar43 * 0x10 + 8);
              *puVar29 = uVar43;
              local_118 = (aiFace *)(puVar29 + 1);
              if (1 < uVar46) {
                paVar34 = local_118;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != local_118 + uVar43);
              }
              if (uVar44 == 0) {
                uVar35 = local_b0[0]._M_allocated_capacity;
                uVar47 = 0;
              }
              else {
                uVar20 = 0;
                do {
                  uVar47 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,uVar20);
                  uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,uVar20 + 1);
                  local_118[uVar20 >> 1].mNumIndices = 2;
                  puVar30 = (uint *)operator_new__(8);
                  local_118[uVar20 >> 1].mIndices = puVar30;
                  *puVar30 = uVar47;
                  puVar30[1] = uVar21;
                  uVar20 = uVar20 + 2;
                  uVar35 = local_b0[0]._M_allocated_capacity;
                  uVar47 = uVar46 >> 1;
                } while (uVar20 < uVar46);
              }
              break;
            case PrimitiveMode_LINE_LOOP:
            case PrimitiveMode_LINE_STRIP:
              uVar47 = uVar46 - (pPVar51->mode == PrimitiveMode_LINE_STRIP);
              local_128 = (ulong)uVar47;
              puVar29 = (ulong *)operator_new__(local_128 * 0x10 + 8);
              *puVar29 = local_128;
              local_118 = (aiFace *)(puVar29 + 1);
              if (uVar47 != 0) {
                paVar34 = local_118;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != local_118 + local_128);
              }
              uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,0);
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,1);
              local_118->mNumIndices = 2;
              puVar30 = (uint *)operator_new__(8);
              puVar29[2] = (ulong)puVar30;
              *puVar30 = uVar20;
              puVar30[1] = uVar21;
              if (2 < uVar46) {
                puVar53 = puVar29 + 4;
                uVar43 = 2;
                do {
                  uVar3 = *(undefined4 *)(puVar53[-2] + 4);
                  uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,(int)uVar43);
                  *(undefined4 *)(puVar53 + -1) = 2;
                  puVar28 = (undefined4 *)operator_new__(8);
                  *puVar53 = (ulong)puVar28;
                  *puVar28 = uVar3;
                  puVar28[1] = uVar20;
                  uVar43 = uVar43 + 1;
                  puVar53 = puVar53 + 2;
                } while (uVar44 != uVar43);
              }
              if (pPVar51->mode != PrimitiveMode_LINE_LOOP) goto LAB_0063aaa4;
              uVar20 = *(uint *)(puVar29[(ulong)(uVar46 - 2) * 2 + 2] + 4);
              uVar21 = *(uint *)puVar29[2];
              local_118[uVar46 - 1].mNumIndices = 2;
              puVar30 = (uint *)operator_new__(8);
              local_118[uVar46 - 1].mIndices = puVar30;
              *puVar30 = uVar20;
              puVar30[1] = uVar21;
              uVar35 = local_b0[0]._M_allocated_capacity;
              break;
            case PrimitiveMode_TRIANGLES:
              local_128 = uVar44 / 3;
              puVar29 = (ulong *)operator_new__(local_128 * 0x10 + 8);
              *puVar29 = local_128;
              local_118 = (aiFace *)(puVar29 + 1);
              if (2 < uVar46) {
                paVar34 = local_118;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != local_118 + local_128);
              }
              if (uVar44 != 0) {
                uVar47 = 0;
                do {
                  uVar44 = (ulong)uVar47 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,uVar47);
                  uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,uVar47 + 1);
                  uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,uVar47 + 2);
                  *(undefined4 *)((long)&local_118->mNumIndices + uVar44) = 3;
                  puVar30 = (uint *)operator_new__(0xc);
                  *(uint **)((long)&local_118->mIndices + uVar44) = puVar30;
                  *puVar30 = uVar20;
                  puVar30[1] = uVar21;
                  puVar30[2] = uVar22;
                  uVar47 = uVar47 + 3;
                } while (uVar47 < uVar46);
                goto LAB_0063aaa4;
              }
              uVar35 = local_b0[0]._M_allocated_capacity;
              uVar47 = 0;
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar47 = uVar46 - 2;
              local_128 = (ulong)uVar47;
              puVar29 = (ulong *)operator_new__(local_128 * 0x10 + 8);
              *puVar29 = local_128;
              local_118 = (aiFace *)(puVar29 + 1);
              if (uVar47 != 0) {
                paVar34 = local_118;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != local_118 + local_128);
              }
              uVar20 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,0);
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,1);
              uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,2);
              local_118->mNumIndices = 3;
              puVar30 = (uint *)operator_new__(0xc);
              puVar29[2] = (ulong)puVar30;
              *puVar30 = uVar20;
              puVar30[1] = uVar21;
              puVar30[2] = uVar22;
              if (uVar46 < 4) goto LAB_0063aaa4;
              puVar29 = puVar29 + 3;
              uVar43 = 3;
              do {
                local_e8 = *(aiMesh **)(puVar29[3] + 4);
                uStack_e0 = 0;
                uVar46 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,(int)uVar43);
                *(undefined4 *)puVar29 = 3;
                puVar31 = (undefined8 *)operator_new__(0xc);
                puVar29[1] = (ulong)puVar31;
                *puVar31 = local_e8;
                *(uint *)(puVar31 + 1) = uVar46;
                uVar43 = uVar43 + 1;
                puVar29 = puVar29 + 2;
                uVar35 = local_b0[0]._M_allocated_capacity;
              } while (uVar44 != uVar43);
              break;
            case PrimitiveMode_TRIANGLE_FAN:
              local_128 = (ulong)(uVar46 - 2);
              local_e8 = (aiMesh *)operator_new__(local_128 * 0x10 + 8);
              local_e8->mPrimitiveTypes = (int)local_128;
              local_e8->mNumVertices = (int)(local_128 >> 0x20);
              local_118 = (aiFace *)&local_e8->mNumFaces;
              if (uVar46 - 2 != 0) {
                ppaVar32 = (aiVector3D **)local_118;
                do {
                  *(uint *)ppaVar32 = 0;
                  ppaVar32[1] = (aiVector3D *)0x0;
                  ppaVar32 = ppaVar32 + 2;
                } while (ppaVar32 != (aiVector3D **)((long)local_118 + local_128 * 4 * 4));
              }
              fVar23 = (float)glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,0);
              fVar24 = (float)glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,1);
              fVar25 = (float)glTF::Accessor::Indexer::GetValue<unsigned_int>(&local_d8,2);
              *(uint *)local_118 = 3;
              paVar33 = (aiVector3D *)operator_new__(0xc);
              local_e8->mVertices = paVar33;
              paVar33->x = fVar23;
              paVar33->y = fVar24;
              paVar33->z = fVar25;
              if (3 < uVar46) {
                ppaVar32 = &local_e8->mNormals;
                uVar43 = 3;
                do {
                  fVar23 = local_e8->mVertices->x;
                  fVar24 = ((aiColor4D *)ppaVar32[3])->b;
                  fVar25 = (float)glTF::Accessor::Indexer::GetValue<unsigned_int>
                                            (&local_d8,(int)uVar43);
                  *(undefined4 *)ppaVar32 = 3;
                  paVar33 = (aiVector3D *)operator_new__(0xc);
                  ppaVar32[1] = paVar33;
                  paVar33->x = fVar23;
                  paVar33->y = fVar24;
                  paVar33->z = fVar25;
                  uVar43 = uVar43 + 1;
                  ppaVar32 = ppaVar32 + 2;
                } while (uVar44 != uVar43);
              }
LAB_0063aaa4:
              uVar35 = local_b0[0]._M_allocated_capacity;
              uVar47 = (uint)local_128;
              break;
            default:
              goto switchD_0063a4d5_default;
            }
            goto LAB_0063ae57;
          }
          PVar2 = pPVar51->mode;
          if (PrimitiveMode_TRIANGLE_FAN < PVar2) goto switchD_0063a4d5_default;
          local_e8 = (aiMesh *)local_b0[0]._0_8_;
          uVar46 = *(uint *)(local_b0[0]._M_allocated_capacity + 4);
          uVar44 = (ulong)uVar46;
          switch(PVar2) {
          case PrimitiveMode_POINTS:
            puVar29 = (ulong *)operator_new__(uVar44 * 0x10 + 8);
            *puVar29 = uVar44;
            local_118 = (aiFace *)(puVar29 + 1);
            if (uVar44 != 0) {
              paVar34 = local_118;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != local_118 + uVar44);
              if (uVar44 != 0) {
                uVar43 = 0;
                do {
                  *(undefined4 *)(puVar29 + 1) = 1;
                  puVar28 = (undefined4 *)operator_new__(4);
                  puVar29[2] = (ulong)puVar28;
                  *puVar28 = (int)uVar43;
                  uVar43 = uVar43 + 1;
                  uVar35 = local_e8;
                  puVar29 = puVar29 + 2;
                  uVar47 = uVar46;
                } while (uVar44 != uVar43);
                goto LAB_0063ae57;
              }
            }
            break;
          case PrimitiveMode_LINES:
            local_128 = (ulong)(uVar46 >> 1);
            puVar29 = (ulong *)operator_new__(local_128 * 0x10 + 8);
            *puVar29 = local_128;
            local_118 = (aiFace *)(puVar29 + 1);
            if (1 < uVar46) {
              paVar34 = local_118;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != local_118 + local_128);
            }
            if (uVar44 != 0) {
              uVar47 = 0;
              do {
                local_118[uVar47 >> 1].mNumIndices = 2;
                puVar30 = (uint *)operator_new__(8);
                local_118[uVar47 >> 1].mIndices = puVar30;
                *puVar30 = uVar47;
                puVar30[1] = uVar47 + 1;
                uVar47 = uVar47 + 2;
              } while (uVar47 < uVar46);
              goto LAB_0063ae44;
            }
            break;
          default:
            uVar47 = uVar46 - (PVar2 == PrimitiveMode_LINE_STRIP);
            local_128 = (ulong)uVar47;
            puVar29 = (ulong *)operator_new__(local_128 * 0x10 + 8);
            *puVar29 = local_128;
            local_118 = (aiFace *)(puVar29 + 1);
            if (uVar47 != 0) {
              paVar34 = local_118;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != local_118 + local_128);
            }
            local_118->mNumIndices = 2;
            puVar31 = (undefined8 *)operator_new__(8);
            puVar29[2] = (ulong)puVar31;
            *puVar31 = 0x100000000;
            if (2 < uVar46) {
              puVar53 = puVar29 + 4;
              uVar43 = 2;
              do {
                uVar3 = *(undefined4 *)(puVar53[-2] + 4);
                *(undefined4 *)(puVar53 + -1) = 2;
                puVar28 = (undefined4 *)operator_new__(8);
                *puVar53 = (ulong)puVar28;
                *puVar28 = uVar3;
                puVar28[1] = (int)uVar43;
                uVar43 = uVar43 + 1;
                puVar53 = puVar53 + 2;
              } while (uVar44 != uVar43);
            }
            uVar35 = local_e8;
            if (pPVar51->mode == PrimitiveMode_LINE_LOOP) {
              uVar47 = *(uint *)(puVar29[(ulong)(uVar46 - 2) * 2 + 2] + 4);
              uVar20 = *(uint *)puVar29[2];
              local_118[uVar46 - 1].mNumIndices = 2;
              puVar30 = (uint *)operator_new__(8);
              local_118[uVar46 - 1].mIndices = puVar30;
              *puVar30 = uVar47;
              puVar30[1] = uVar20;
              goto LAB_0063ae44;
            }
            goto LAB_0063ae57;
          case PrimitiveMode_TRIANGLES:
            local_128 = uVar44 / 3;
            puVar29 = (ulong *)operator_new__(local_128 * 0x10 + 8);
            *puVar29 = local_128;
            local_118 = (aiFace *)(puVar29 + 1);
            if (2 < uVar46) {
              paVar34 = local_118;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != local_118 + local_128);
            }
            if (uVar44 != 0) {
              uVar47 = 0;
              do {
                uVar44 = (ulong)uVar47 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                *(undefined4 *)((long)&local_118->mNumIndices + uVar44) = 3;
                puVar30 = (uint *)operator_new__(0xc);
                *(uint **)((long)&local_118->mIndices + uVar44) = puVar30;
                *puVar30 = uVar47;
                puVar30[1] = uVar47 + 1;
                puVar30[2] = uVar47 + 2;
                uVar47 = uVar47 + 3;
              } while (uVar47 < uVar46);
              goto LAB_0063ae44;
            }
            break;
          case PrimitiveMode_TRIANGLE_STRIP:
            local_128 = (ulong)(uVar46 - 2);
            puVar29 = (ulong *)operator_new__(local_128 * 0x10 + 8);
            *puVar29 = local_128;
            local_118 = (aiFace *)(puVar29 + 1);
            if (uVar46 - 2 != 0) {
              paVar34 = local_118;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != local_118 + local_128);
            }
            local_118->mNumIndices = 3;
            puVar31 = (undefined8 *)operator_new__(0xc);
            puVar29[2] = (ulong)puVar31;
            *puVar31 = 0x100000000;
            *(undefined4 *)(puVar31 + 1) = 2;
            if (3 < uVar46) {
              puVar29 = puVar29 + 3;
              uVar43 = 3;
              do {
                uVar35 = *(undefined8 *)(puVar29[3] + 4);
                *(undefined4 *)puVar29 = 3;
                puVar31 = (undefined8 *)operator_new__(0xc);
                puVar29[1] = (ulong)puVar31;
                *puVar31 = uVar35;
                *(int *)(puVar31 + 1) = (int)uVar43;
                uVar43 = uVar43 + 1;
                puVar29 = puVar29 + 2;
              } while (uVar44 != uVar43);
            }
            goto LAB_0063ae44;
          case PrimitiveMode_TRIANGLE_FAN:
            uVar47 = uVar46 - 2;
            local_128 = (ulong)uVar47;
            puVar29 = (ulong *)operator_new__(local_128 * 0x10 + 8);
            *puVar29 = local_128;
            local_118 = (aiFace *)(puVar29 + 1);
            if (uVar47 != 0) {
              paVar34 = local_118;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != local_118 + local_128);
            }
            local_118->mNumIndices = 3;
            puVar31 = (undefined8 *)operator_new__(0xc);
            puVar29[2] = (ulong)puVar31;
            *puVar31 = 0x100000000;
            *(undefined4 *)(puVar31 + 1) = 2;
            if (3 < uVar46) {
              puVar53 = puVar29 + 3;
              uVar43 = 3;
              do {
                uVar3 = *(undefined4 *)puVar29[2];
                uVar4 = *(undefined4 *)(puVar53[3] + 8);
                *(undefined4 *)puVar53 = 3;
                puVar28 = (undefined4 *)operator_new__(0xc);
                puVar53[1] = (ulong)puVar28;
                *puVar28 = uVar3;
                puVar28[1] = uVar4;
                puVar28[2] = (int)uVar43;
                uVar43 = uVar43 + 1;
                puVar53 = puVar53 + 2;
                uVar35 = local_e8;
              } while (uVar44 != uVar43);
              goto LAB_0063ae57;
            }
LAB_0063ae44:
            uVar35 = local_e8;
            uVar47 = (uint)local_128;
LAB_0063ae57:
            ((aiMesh *)uVar35)->mFaces = local_118;
            ((aiMesh *)uVar35)->mNumFaces = uVar47;
            if (uVar47 != 0) {
              uVar44 = 0;
              bVar56 = false;
              do {
                if ((ulong)local_118[uVar44].mNumIndices != 0) {
                  uVar43 = 0;
                  do {
                    if (((aiMesh *)uVar35)->mNumVertices <= local_118[uVar44].mIndices[uVar43]) {
                      if (!bVar56) {
                        __assert_fail("CheckValidFacesIndices(faces, nFaces, aim->mNumVertices)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF/glTFImporter.cpp"
                                      ,0x1c2,
                                      "void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
                      }
                      goto switchD_0063a4d5_default;
                    }
                    uVar43 = uVar43 + 1;
                  } while (local_118[uVar44].mNumIndices != uVar43);
                }
                uVar44 = uVar44 + 1;
                bVar56 = uVar47 <= uVar44;
              } while (uVar44 != uVar47);
            }
            goto switchD_0063a4d5_default;
          }
          local_e8->mFaces = local_118;
          local_e8->mNumFaces = 0;
switchD_0063a4d5_default:
          if ((pPVar51->material).vector !=
              (vector<glTF::Material_*,_std::allocator<glTF::Material_*>_> *)0x0) {
            *(uint *)(local_b0[0]._M_allocated_capacity + 0xe8) = (pPVar51->material).index;
          }
          uVar44 = (ulong)(iVar52 + 1);
          pPVar51 = (local_b8->primitives).
                    super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar43 = ((long)*(pointer *)
                           ((long)&(local_b8->primitives).
                                   super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                   ._M_impl + 8) - (long)pPVar51 >> 4) * 0x4ec4ec4ec4ec4ec5;
        } while (uVar44 <= uVar43 && uVar43 - uVar44 != 0);
      }
      uVar55 = uVar55 + 1;
      ppMVar26 = (local_68->meshes).mObjs.
                 super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar55 < ((ulong)((long)(local_68->meshes).mObjs.
                                     super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar26) >>
                       3 & 0xffffffff));
  }
  pgVar18 = local_90;
  iVar6._M_current =
       (local_90->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (local_90->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_90->meshOffsets,iVar6,
               &local_ec);
  }
  else {
    *iVar6._M_current = local_ec;
    ppuVar15 = &(local_90->meshOffsets).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *ppuVar15 = *ppuVar15 + 1;
  }
  iVar19._M_current = iStack_80._M_current;
  ppaVar16 = local_88;
  paVar13 = pgVar18->mScene;
  uVar46 = (uint)((ulong)((long)iStack_80._M_current - (long)local_88) >> 3);
  paVar13->mNumMeshes = uVar46;
  ppaVar45 = local_88;
  if (uVar46 != 0) {
    ppaVar36 = (aiMesh **)operator_new__((long)iStack_80._M_current - (long)local_88 & 0x7fffffff8);
    paVar13->mMeshes = ppaVar36;
    ppaVar45 = ppaVar16;
    for (; ppaVar16 != iVar19._M_current; ppaVar16 = ppaVar16 + 1) {
      paVar27 = *ppaVar16;
      *ppaVar16 = *ppaVar36;
      *ppaVar36 = paVar27;
      ppaVar36 = ppaVar36 + 1;
      ppaVar45 = local_88;
    }
  }
  if (ppaVar45 != (aiMesh **)0x0) {
    operator_delete(ppaVar45);
  }
  return;
}

Assistant:

void glTFImporter::ImportMeshes(glTF::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

		// Check if mesh extensions is used
		if(mesh.Extension.size() > 0)
		{
			for(Mesh::SExtension* cur_ext : mesh.Extension)
			{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
				if(cur_ext->Type == Mesh::SExtension::EType::Compression_Open3DGC)
				{
					// Limitations for meshes when using Open3DGC-compression.
					// It's a current limitation of sp... Specification have not this part still - about mesh compression. Why only one primitive?
					// Because glTF is very flexibly. But in fact it ugly flexible. Every primitive can has own set of accessors and accessors can
					// point to a-a-a-a-any part of buffer (through bufferview of course) and even to another buffer. We know that "Open3DGC-compression"
					// is applicable only to part of buffer. As we can't guaranty continuity of the data for decoder, we will limit quantity of primitives.
					// Yes indices, coordinates etc. still can br stored in different buffers, but with current specification it's a exporter problem.
					// Also primitive can has only one of "POSITION", "NORMAL" and less then "AI_MAX_NUMBER_OF_TEXTURECOORDS" of "TEXCOORD". All accessor
					// of primitive must point to one continuous region of the buffer.
					if(mesh.primitives.size() > 2) throw DeadlyImportError("GLTF: When using Open3DGC compression then only one primitive per mesh are allowed.");

					Mesh::SCompression_Open3DGC* o3dgc_ext = (Mesh::SCompression_Open3DGC*)cur_ext;
					Ref<Buffer> buf = r.buffers.Get(o3dgc_ext->Buffer);

					buf->EncodedRegion_SetCurrent(mesh.id);
				}
				else
#endif
				{
					throw DeadlyImportError("GLTF: Can not import mesh: unknown mesh extension (code: \"" + to_string(cur_ext->Type) +
											"\"), only Open3DGC is supported.");
				}
			}
		}// if(mesh.Extension.size() > 0)

		meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.id;
            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = attr.position[0]->count;
                attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) attr.normal[0]->ExtractData(aim->mNormals);

            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }


            aiFace* faces = 0;
            unsigned int nFaces = 0;

            if (prim.indices) {
                unsigned int count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks 
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = nFaces;
                ai_assert(CheckValidFacesIndices(faces, nFaces, aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}